

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
gtl::internal_btree::
btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>,_const_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_&,_const_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_*>
::decrement_slow(btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>,_const_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_&,_const_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_*>
                 *this)

{
  undefined8 uVar1;
  bool bVar2;
  byte bVar3;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
  *pbVar4;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
  *pbVar5;
  uint i;
  btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>,_const_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_&,_const_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_*>
  save;
  int iStack_20;
  
  bVar2 = btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
          ::leaf(this->node);
  i = this->position;
  if (bVar2) {
    if (-1 < (int)i) {
      __assert_fail("position <= -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x703,
                    "void gtl::internal_btree::btree_iterator<const gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>, const std::pair<const S2CellId, S2PointIndex<int>::PointData> &, const std::pair<const S2CellId, S2PointIndex<int>::PointData> *>::decrement_slow() [Node = const gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>, Reference = const std::pair<const S2CellId, S2PointIndex<int>::PointData> &, Pointer = const std::pair<const S2CellId, S2PointIndex<int>::PointData> *]"
                   );
    }
    pbVar5 = this->node;
    uVar1 = *(undefined8 *)&this->position;
    while ((int)i < 0) {
      bVar2 = btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
              ::is_root(this->node);
      if (bVar2) {
        if (-1 < this->position) {
          return;
        }
        iStack_20 = (int)uVar1;
        this->position = iStack_20;
        this->node = pbVar5;
        return;
      }
      pbVar4 = btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
               ::parent(this->node);
      bVar3 = btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
              ::position(this->node);
      pbVar4 = btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
               ::child(pbVar4,(uint)bVar3);
      if (pbVar4 != this->node) {
        __assert_fail("node->parent()->child(node->position()) == node",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                      ,0x706,
                      "void gtl::internal_btree::btree_iterator<const gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>, const std::pair<const S2CellId, S2PointIndex<int>::PointData> &, const std::pair<const S2CellId, S2PointIndex<int>::PointData> *>::decrement_slow() [Node = const gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>, Reference = const std::pair<const S2CellId, S2PointIndex<int>::PointData> &, Pointer = const std::pair<const S2CellId, S2PointIndex<int>::PointData> *]"
                     );
      }
      bVar3 = btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
              ::position(this->node);
      this->position = bVar3 - 1;
      pbVar4 = btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
               ::parent(this->node);
      this->node = pbVar4;
      i = this->position;
    }
  }
  else {
    if ((int)i < 0) {
      __assert_fail("position >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x70e,
                    "void gtl::internal_btree::btree_iterator<const gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>, const std::pair<const S2CellId, S2PointIndex<int>::PointData> &, const std::pair<const S2CellId, S2PointIndex<int>::PointData> *>::decrement_slow() [Node = const gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>, Reference = const std::pair<const S2CellId, S2PointIndex<int>::PointData> &, Pointer = const std::pair<const S2CellId, S2PointIndex<int>::PointData> *]"
                   );
    }
    pbVar5 = this->node;
    do {
      pbVar5 = btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
               ::child(pbVar5,i);
      this->node = pbVar5;
      bVar2 = btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
              ::leaf(pbVar5);
      pbVar5 = this->node;
      bVar3 = btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
              ::count(pbVar5);
      i = (uint)bVar3;
    } while (!bVar2);
    this->position = i - 1;
  }
  return;
}

Assistant:

void btree_iterator<N, R, P>::decrement_slow() {
  if (node->leaf()) {
    assert(position <= -1);
    btree_iterator save(*this);
    while (position < 0 && !node->is_root()) {
      assert(node->parent()->child(node->position()) == node);
      position = node->position() - 1;
      node = node->parent();
    }
    if (position < 0) {
      *this = save;
    }
  } else {
    assert(position >= 0);
    node = node->child(position);
    while (!node->leaf()) {
      node = node->child(node->count());
    }
    position = node->count() - 1;
  }
}